

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::(anonymous_namespace)::FormatTimes_abi_cxx11_(int n)

{
  ostream *poVar1;
  int in_ESI;
  string *in_RDI;
  stringstream ss;
  stringstream local_1a8 [16];
  undefined1 local_198 [379];
  allocator local_1d [16];
  allocator local_d;
  int local_c;
  
  if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"once",&local_d);
    std::allocator<char>::~allocator((allocator<char> *)&local_d);
  }
  else if (in_ESI == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"twice",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else {
    local_c = in_ESI;
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar1 = (ostream *)std::ostream::operator<<(local_198,local_c);
    std::operator<<(poVar1," times");
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return in_RDI;
}

Assistant:

inline internal::string FormatTimes(int n) {
  if (n == 1) {
    return "once";
  } else if (n == 2) {
    return "twice";
  } else {
    std::stringstream ss;
    ss << n << " times";
    return ss.str();
  }
}